

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::DeclareStruct(CWriter *this,TypeVector *types)

{
  char cVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  TypeVector *in_RDX;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  Newline local_80;
  Newline local_7f;
  CloseBrace local_7e [2];
  Type local_7c;
  Type local_74;
  Type local_6c;
  Type type;
  Index i;
  undefined1 local_38 [8];
  string name;
  TypeVector *types_local;
  CWriter *this_local;
  
  name.field_2._8_8_ = types;
  (anonymous_namespace)::CWriter::MangleTypes_abi_cxx11_((string *)local_38,(CWriter *)types,in_RDX)
  ;
  pVar5 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->typevector_structs_,(string *)local_38);
  if (((pVar5.second ^ 0xffU) & 1) == 0) {
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::Newline,char_const(&)[9],std::__cxx11::string_const&,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(Newline *)((long)&type.type_index_ + 3),(char (*) [9])"#ifndef ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (Newline *)((long)&type.type_index_ + 2));
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [9])"#define ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (char (*) [2])0x36dfa4,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (Newline *)((long)&type.type_index_ + 1));
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,(char (*) [8])0x37c51d,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (char (*) [2])0x36dfa4,(OpenBrace *)&type.type_index_);
    for (type.enum_ = Any; uVar2 = (ulong)(uint)type.enum_,
        sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                          ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)name.field_2._8_8_),
        uVar2 < sVar3; type.enum_ = type.enum_ + ~I64) {
      pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)name.field_2._8_8_,
                          (ulong)(uint)type.enum_);
      local_74.enum_ = pvVar4->enum_;
      local_74.type_index_ = pvVar4->type_index_;
      local_6c = local_74;
      Write(this,local_74);
      local_7c = local_6c;
      cVar1 = MangleType(local_6c);
      Writef(this," %c%d;",(ulong)(uint)(int)cVar1,(ulong)(uint)type.enum_);
      Write(this);
    }
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::CloseBrace,char_const(&)[2],wabt::(anonymous_namespace)::Newline,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,local_7e,(char (*) [2])0x37ca1e,&local_7f,
               (char (*) [12])"#endif  /* ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (char (*) [4])0x37c2f4,&local_80);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void CWriter::DeclareStruct(const TypeVector& types) {
  const std::string name = MangleTypes(types);
  if (!typevector_structs_.insert(name).second) {
    return;
  }

  Write(Newline(), "#ifndef ", name, Newline());
  Write("#define ", name, " ", name, Newline());
  Write("struct ", name, " ", OpenBrace());
  for (Index i = 0; i < types.size(); ++i) {
    const Type type = types[i];
    Write(type);
    Writef(" %c%d;", MangleType(type), i);
    Write(Newline());
  }
  Write(CloseBrace(), ";", Newline(), "#endif  /* ", name, " */", Newline());
}